

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O0

int X509_NAME_add_entry_by_NID
              (X509_NAME *name,int nid,int type,uchar *bytes,int len,int loc,int set)

{
  X509_NAME_ENTRY *ne_00;
  int ret;
  X509_NAME_ENTRY *ne;
  int loc_local;
  ossl_ssize_t len_local;
  uchar *bytes_local;
  int type_local;
  int nid_local;
  X509_NAME *name_local;
  
  ne_00 = X509_NAME_ENTRY_create_by_NID((X509_NAME_ENTRY **)0x0,nid,type,bytes,len);
  if (ne_00 == (X509_NAME_ENTRY *)0x0) {
    name_local._4_4_ = 0;
  }
  else {
    name_local._4_4_ = X509_NAME_add_entry(name,ne_00,loc,set);
    X509_NAME_ENTRY_free(ne_00);
  }
  return name_local._4_4_;
}

Assistant:

int X509_NAME_add_entry_by_NID(X509_NAME *name, int nid, int type,
                               const unsigned char *bytes, ossl_ssize_t len,
                               int loc, int set) {
  X509_NAME_ENTRY *ne =
      X509_NAME_ENTRY_create_by_NID(NULL, nid, type, bytes, len);
  if (!ne) {
    return 0;
  }
  int ret = X509_NAME_add_entry(name, ne, loc, set);
  X509_NAME_ENTRY_free(ne);
  return ret;
}